

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

uint get_tmx_tile_id(vector<Tile_*,_std::allocator<Tile_*>_> *tilemap,int index)

{
  ushort uVar1;
  value_type pTVar2;
  reference ppTVar3;
  uint local_28;
  uint local_24;
  uint id;
  Tile *t;
  int index_local;
  vector<Tile_*,_std::allocator<Tile_*>_> *tilemap_local;
  
  ppTVar3 = std::vector<Tile_*,_std::allocator<Tile_*>_>::at(tilemap,(long)index);
  pTVar2 = *ppTVar3;
  if (pTVar2->original_tile == (Tile *)0x0) {
    uVar1 = pTVar2->id;
  }
  else {
    uVar1 = pTVar2->original_tile->id;
  }
  local_28 = (uint)uVar1;
  local_24 = local_28 + 1;
  if ((pTVar2->flipped_x & 1U) != 0) {
    local_24 = local_24 | 0x80000000;
  }
  if ((pTVar2->flipped_y & 1U) != 0) {
    local_24 = local_24 | 0x40000000;
  }
  return local_24;
}

Assistant:

unsigned int get_tmx_tile_id(std::vector<Tile *> *tilemap, int index) {
    Tile *t = tilemap->at(index);

    unsigned int id = t->original_tile != NULL ? (unsigned int) t->original_tile->id : (unsigned int) t->id;
    id++;
    if (t->flipped_x) {
        id = id | TMX_FLIP_X_FLAG;
    }
    if (t->flipped_y) {
        id = id | TMX_FLIP_Y_FLAG;
    }

    return id;
}